

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DatatypeValidatorFactory::initCanRepRegistory(DatatypeValidatorFactory *this)

{
  XMLSize_t XVar1;
  MemoryManager *pMVar2;
  int iVar3;
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *pRVar4;
  undefined4 extraout_var;
  DatatypeValidator *pDVar5;
  XMLCanRepGroup *pXVar6;
  XMLSize_t XVar7;
  size_t in_RSI;
  undefined2 *size;
  undefined1 *puVar8;
  undefined8 *size_00;
  
  pRVar4 = (RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *)
           XMemory::operator_new((XMemory *)0x38,in_RSI);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar4->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar4->fAdoptedElems = true;
  pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XMLCanRepGroup> **)0x0;
  pRVar4->fHashModulus = 0x1d;
  pRVar4->fInitialModulus = 0x1d;
  pRVar4->fCount = 0;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,0xe8);
  pRVar4->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::XMLCanRepGroup> **)CONCAT44(extraout_var,iVar3);
  XVar1 = pRVar4->fHashModulus;
  if (XVar1 != 0) {
    XVar7 = 0;
    do {
      pRVar4->fBucketList[XVar7] = (RefHashTableBucketElem<xercesc_4_0::XMLCanRepGroup> *)0x0;
      XVar7 = XVar7 + 1;
    } while (XVar1 != XVar7);
  }
  size = &SchemaSymbols::fgDT_DECIMAL;
  fCanRepRegistry = pRVar4;
  pDVar5 = getDatatypeValidator(this,L"decimal");
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)size);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_INTEGER;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_LONG;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_LONG);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  size_00 = &SchemaSymbols::fgDT_INT;
  pDVar5 = getDatatypeValidator(this,L"int");
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)size_00);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_SHORT;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_SHORT);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_BYTE;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_BYTE);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_NONNEGATIVEINTEGER;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_POSITIVEINTEGER;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_POSITIVEINTEGER);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_signed);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_NEGATIVEINTEGER;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NEGATIVEINTEGER);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_ULONG;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_ULONG);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_UINT;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_UINT);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_USHORT;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_USHORT);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_UBYTE;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_UBYTE);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_unsigned);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  pRVar4 = fCanRepRegistry;
  puVar8 = SchemaSymbols::fgDT_NONPOSITIVEINTEGER;
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  pXVar6 = (XMLCanRepGroup *)XMemory::operator_new((XMemory *)0x4,(size_t)puVar8);
  XMLCanRepGroup::XMLCanRepGroup(pXVar6,Decimal_Derived_npi);
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::put(pRVar4,pDVar5,pXVar6);
  return;
}

Assistant:

void DatatypeValidatorFactory::initCanRepRegistory()
{

     /***
      * key:  dv
      * data: XMLCanRepGroup
      ***/
     fCanRepRegistry  = new RefHashTableOf<XMLCanRepGroup, PtrHasher>(29, true);

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_DECIMAL),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal));

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_LONG),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_INT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_SHORT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_BYTE),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_POSITIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_signed));

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_NEGATIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_ULONG),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_UINT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_USHORT),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));
     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_UBYTE),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_unsigned));

     fCanRepRegistry->put((void*) getDatatypeValidator(SchemaSymbols::fgDT_NONPOSITIVEINTEGER),
                        new  XMLCanRepGroup(XMLCanRepGroup::Decimal_Derived_npi));
}